

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.cpp
# Opt level: O0

void cbPlayback(void *userdata,uint8_t *stream,int len)

{
  ulong uVar1;
  long in_RSI;
  char *in_RDI;
  int keyPressed;
  ifstream *fin;
  uint local_24;
  char *local_20;
  long local_10;
  
  local_24 = 0xffffffff;
  local_20 = in_RDI;
  local_10 = in_RSI;
  std::istream::read(in_RDI,(long)&local_24);
  uVar1 = std::ios::eof();
  if ((uVar1 & 1) == 0) {
    printf("%c",(ulong)local_24);
    fflush(_stdout);
    std::istream::read(local_20,local_10);
    uVar1 = std::ios::eof();
    if ((uVar1 & 1) != 0) {
      g_terminate = true;
    }
  }
  else {
    g_terminate = true;
  }
  return;
}

Assistant:

void cbPlayback(void * userdata, uint8_t * stream, int len) {
    std::ifstream * fin = (std::ifstream *)(userdata);
    int keyPressed = -1;
    fin->read((char *)(&keyPressed), sizeof(keyPressed));
    if (fin->eof()) {
        g_terminate = true;
        return;
    }
    printf("%c", keyPressed);
    fflush(stdout);
    fin->read((char *)(stream), len); // todo
    if (fin->eof()) g_terminate = true;
}